

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadLineDefs(MapData *map)

{
  double *pdVar1;
  byte *pbVar2;
  double dVar3;
  ushort uVar4;
  ushort uVar5;
  FileReader *pFVar6;
  undefined1 auVar7 [16];
  long lVar8;
  DWORD DVar9;
  int iVar10;
  maplinedef_t *pmVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  maplinedef_t *pmVar16;
  uint uVar17;
  line_t *ld;
  
  pFVar6 = map->MapLumps[2].Reader;
  if (pFVar6 == (FileReader *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)(int)pFVar6->Length;
  }
  uVar17 = (uint)(uVar13 / 0xe);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(int)uVar17;
  uVar14 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x98),8) == 0) {
    uVar14 = SUB168(auVar7 * ZEXT816(0x98),0);
  }
  numlines = uVar17;
  lines = (line_t *)operator_new__(uVar14);
  uVar12 = uVar17;
  if (linemap.Count <= uVar17 && uVar17 - linemap.Count != 0) {
    TArray<int,_int>::Grow(&linemap,uVar17 - linemap.Count);
    uVar12 = numlines;
  }
  linemap.Count = uVar17;
  memset(lines,0,(long)(int)uVar12 * 0x98);
  pmVar11 = (maplinedef_t *)operator_new__(uVar13);
  pFVar6 = map->MapLumps[2].Reader;
  lVar8 = pFVar6->Length;
  map->file = pFVar6;
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar6,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pmVar11,(long)(int)lVar8);
  sidecount = 0;
  if (0 < numlines) {
    uVar17 = 0;
    iVar15 = 0;
    do {
      uVar4 = pmVar11[(int)uVar17].v1;
      uVar13 = (ulong)uVar4;
      uVar5 = pmVar11[(int)uVar17].v2;
      uVar12 = (uint)uVar5;
      if ((int)(uint)uVar4 < numvertexes && (int)(uint)uVar5 < numvertexes) {
        pmVar16 = pmVar11 + (int)uVar17;
        if (uVar4 == uVar5) {
LAB_00564730:
          Printf("Removing 0-length line %d\n",(ulong)(iVar15 + uVar17));
          iVar10 = numlines;
          memmove(pmVar16,pmVar16 + 1,(long)(int)(~uVar17 + numlines) * 0xe);
          ForceNodeBuild = true;
          iVar15 = iVar15 + 1;
          numlines = iVar10 + -1;
        }
        else {
          dVar3 = vertexes[uVar13].p.X;
          if ((dVar3 == vertexes[uVar12].p.X) && (!NAN(dVar3) && !NAN(vertexes[uVar12].p.X))) {
            dVar3 = vertexes[uVar13].p.Y;
            pdVar1 = &vertexes[uVar12].p.Y;
            if ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1))) goto LAB_00564730;
          }
          if (pmVar16->sidenum[0] == 0xffff) {
            Printf("Line %d has no first side.\n",(ulong)uVar17);
            pmVar16->sidenum[0] = 0;
          }
          iVar10 = sidecount + 1;
          if (pmVar16->sidenum[1] != 0xffff) {
            iVar10 = sidecount + 2;
          }
          sidecount = iVar10;
          linemap.Array[(int)uVar17] = iVar15 + uVar17;
          uVar17 = uVar17 + 1;
        }
      }
      else {
        operator_delete__(pmVar11);
        I_Error("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.",
                (ulong)(iVar15 + uVar17),uVar13,(ulong)uVar12,(ulong)(uint)numvertexes);
      }
    } while ((int)uVar17 < numlines);
  }
  P_AllocateSideDefs(sidecount);
  if (0 < numlines) {
    iVar15 = 0;
    pmVar16 = pmVar11;
    ld = lines;
    do {
      ld->alpha = 1.0;
      ld->portalindex = 0xffffffff;
      P_TranslateLineDef(ld,pmVar16,-1);
      if ((((ld->special == 0xbe) && (ld->args[1] - 0xfdU < 2)) ||
          (FTagManager::AddLineID(&tagManager,iVar15,(int)pmVar16->tag), ld->special == 0xbe)) &&
         (ld->args[1] == 0xfe)) {
        ProcessEDLinedef(ld,(int)pmVar16->tag);
      }
      ld->v1 = vertexes + pmVar16->v1;
      ld->v2 = vertexes + pmVar16->v2;
      P_SetSideNum(ld->sidedef,pmVar16->sidenum[0]);
      P_SetSideNum(ld->sidedef + 1,pmVar16->sidenum[1]);
      P_AdjustLine(ld);
      P_SaveLineSpecial(ld);
      DVar9 = level.flags2;
      if ((level.flags2 >> 9 & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((DVar9 >> 10 & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 0x10;
      }
      if ((DVar9 >> 0xb & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 0x40;
      }
      iVar15 = iVar15 + 1;
      pmVar16 = pmVar16 + 1;
      ld = ld + 1;
    } while (iVar15 < numlines);
  }
  operator_delete__(pmVar11);
  return;
}

Assistant:

void P_LoadLineDefs (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef_t *mld;
		
	numlines = lumplen / sizeof(maplinedef_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Count the number of sidedef references. This is the number of
	// sidedefs we need. The actual number in the SIDEDEFS lump might be less.
	// Lines with 0 length are also removed.

	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef_t*)mldf) + i;
		int v1 = LittleShort(mld->v1);
		int v2 = LittleShort(mld->v2);

		if (v1 >= numvertexes || v2 >= numvertexes)
		{
			delete [] mldf;
			I_Error ("Line %d has invalid vertices: %d and/or %d.\nThe map only contains %d vertices.", i+skipped, v1, v2, numvertexes);
		}
		else if (v1 == v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			ForceNodeBuild = true;
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		ld->alpha = 1.;	// [RH] Opaque by default
		ld->portalindex = UINT_MAX;

		// [RH] Translate old linedef special and flags to be
		//		compatible with the new format.

		P_TranslateLineDef (ld, mld, -1);
		// do not assign the tag for Extradata lines.
		if (ld->special != Static_Init || (ld->args[1] != Init_EDLine && ld->args[1] != Init_EDSector))
		{
			tagManager.AddLineID(i, mld->tag);
		}
#ifndef NO_EDATA
		if (ld->special == Static_Init && ld->args[1] == Init_EDLine)
		{
			ProcessEDLinedef(ld, mld->tag);
		}
#endif

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;
	}
	delete[] mldf;
}